

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffcmph(fitsfile *fptr,int *status)

{
  int iVar1;
  char *__ptr;
  fitsfile *fptr_00;
  int *status_00;
  long lVar2;
  int *in_RSI;
  long in_RDI;
  LONGLONG t2heapsize;
  LONGLONG t1heapsize;
  LONGLONG endpos;
  LONGLONG writeheapstart;
  LONGLONG readheapstart;
  LONGLONG pcount;
  char message [81];
  char comm [73];
  char *tbuff;
  char *buffer;
  LONGLONG offset;
  LONGLONG repeat;
  LONGLONG overlap;
  LONGLONG unused;
  long nbytes;
  long nblock;
  long buffsize;
  long ii;
  int valid;
  int pixsize;
  int typecode;
  int jj;
  fitsfile *tptr;
  int *in_stack_00000738;
  char *in_stack_00000740;
  fitsfile **in_stack_00000748;
  int *in_stack_000009e8;
  long in_stack_000009f0;
  fitsfile *in_stack_000009f8;
  int *in_stack_000015b0;
  int in_stack_000015bc;
  long in_stack_000015c0;
  fitsfile *in_stack_000015c8;
  int in_stack_fffffffffffffe8c;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  undefined1 uVar3;
  fitsfile *in_stack_fffffffffffffe98;
  undefined8 uVar4;
  fitsfile *in_stack_fffffffffffffea0;
  long *repeat_00;
  fitsfile *in_stack_fffffffffffffea8;
  LONGLONG *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  fitsfile *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  fitsfile *in_stack_fffffffffffffee8;
  LONGLONG in_stack_fffffffffffffef0;
  fitsfile *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff48;
  LONGLONG *in_stack_ffffffffffffff50;
  LONGLONG *in_stack_ffffffffffffff58;
  LONGLONG *in_stack_ffffffffffffff60;
  fitsfile *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff90;
  fitsfile *in_stack_ffffffffffffff98;
  long local_60;
  long local_58;
  size_t local_50;
  size_t local_40;
  long local_38;
  int local_30;
  int local_28;
  int local_24;
  long local_20;
  int local_4;
  
  local_40 = 10000;
  if (*in_RSI < 1) {
    fftheap(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
            in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (local_30 == 0) {
      *in_RSI = 0x108;
      local_4 = 0x108;
    }
    else if ((((*(int *)(*(long *)(in_RDI + 8) + 0x58) == 2) &&
              (*(long *)(*(long *)(in_RDI + 8) + 0x3e0) != 0)) &&
             ((local_58 != 0 || (local_60 != 0)))) && (*in_RSI < 1)) {
      iVar1 = ffinit(in_stack_00000748,in_stack_00000740,in_stack_00000738);
      if (iVar1 == 0) {
        iVar1 = ffcopy(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                       (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                       (int *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        if (iVar1 == 0) {
          __ptr = (char *)malloc(10000);
          if (__ptr == (char *)0x0) {
            snprintf(&stack0xfffffffffffffec8,0x51,"Failed to allocate buffer to copy the heap");
            ffpmsg((char *)0x168a1c);
            ffclos(in_stack_fffffffffffffe98,
                   (int *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
            *in_RSI = 0x71;
            local_4 = 0x71;
          }
          else {
            fptr_00 = (fitsfile *)
                      (*(long *)(*(long *)(local_20 + 8) + 0x88) +
                      *(long *)(*(long *)(local_20 + 8) + 0x3d8));
            status_00 = (int *)(*(long *)(*(long *)(in_RDI + 8) + 0x88) +
                               *(long *)(*(long *)(in_RDI + 8) + 0x3d8));
            repeat_00 = *(long **)(*(long *)(in_RDI + 8) + 0x3e0);
            *(undefined8 *)(*(long *)(in_RDI + 8) + 0x3e0) = 0;
            local_24 = 1;
            while( true ) {
              uVar3 = false;
              if (local_24 <= *(int *)(*(long *)(in_RDI + 8) + 0x3b0)) {
                uVar3 = *in_RSI < 1;
              }
              if ((bool)uVar3 == false) break;
              ffgtcl(fptr_00,(int)((ulong)status_00 >> 0x20),&in_stack_fffffffffffffea8->HDUposition
                     ,repeat_00,(long *)in_stack_fffffffffffffe98,
                     (int *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
              if (local_28 < 1) {
                for (local_38 = 1; local_38 <= *(long *)(*(long *)(in_RDI + 8) + 0x3c0);
                    local_38 = local_38 + 1) {
                  ffgdesll(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                           (LONGLONG)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           (LONGLONG *)fptr_00,status_00);
                  if (local_28 == -1) {
                    local_50 = (long)&in_stack_ffffffffffffff98->field_0x7 / 8;
                  }
                  else {
                    local_50 = (long)in_stack_ffffffffffffff98 * (long)(-local_28 / 10);
                  }
                  if ((long)local_40 < (long)local_50) {
                    in_stack_ffffffffffffff80 = (char *)realloc(__ptr,local_50);
                    if (in_stack_ffffffffffffff80 == (char *)0x0) {
                      *in_RSI = 0x71;
                    }
                    else {
                      local_40 = local_50;
                      __ptr = in_stack_ffffffffffffff80;
                    }
                  }
                  if ((*(int *)(*(long *)(in_RDI + 8) + 0x38) == 0) &&
                     (in_stack_fffffffffffffea8 =
                           (fitsfile *)
                           ((long)status_00 + local_50 + *(long *)(*(long *)(in_RDI + 8) + 0x3e0)),
                     *(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x68) +
                              (long)(*(int *)(*(long *)(in_RDI + 8) + 0x54) + 1) * 8) <
                     (long)in_stack_fffffffffffffea8)) {
                    lVar2 = (long)in_stack_fffffffffffffea8 +
                            (-1 - *(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x68) +
                                           (long)(*(int *)(*(long *)(in_RDI + 8) + 0x54) + 1) * 8));
                    iVar1 = ffiblk(in_stack_000015c8,in_stack_000015c0,in_stack_000015bc,
                                   in_stack_000015b0);
                    if (0 < iVar1) {
                      snprintf(&stack0xfffffffffffffec8,0x51,
                               "Failed to extend the size of the variable length heap by %ld blocks."
                               ,lVar2 / 0xb40 + 1);
                      ffpmsg((char *)0x168d8d);
                    }
                  }
                  ffmbyt(in_stack_fffffffffffffea8,(LONGLONG)repeat_00,
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                         (int *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
                  ffgbyt(in_stack_fffffffffffffee8,(LONGLONG)in_stack_fffffffffffffee0,
                         in_stack_fffffffffffffed8,
                         (int *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
                  ffmbyt(in_stack_fffffffffffffea8,(LONGLONG)repeat_00,
                         (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                         (int *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
                  ffpbyt(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                         in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
                  ffpdes(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                         (LONGLONG)in_stack_fffffffffffffec8,(LONGLONG)in_stack_fffffffffffffec0,
                         (LONGLONG)fptr_00,status_00);
                  *(size_t *)(*(long *)(in_RDI + 8) + 0x3e0) =
                       local_50 + *(long *)(*(long *)(in_RDI + 8) + 0x3e0);
                  if (0 < *in_RSI) {
                    free(__ptr);
                    ffclos(in_stack_fffffffffffffe98,
                           (int *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
                    return *in_RSI;
                  }
                }
              }
              local_24 = local_24 + 1;
            }
            free(__ptr);
            ffclos(in_stack_fffffffffffffe98,(int *)CONCAT17(uVar3,in_stack_fffffffffffffe90));
            if (0 < (*(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x68) +
                              (long)(*(int *)(*(long *)(in_RDI + 8) + 0x54) + 1) * 8) -
                    ((long)status_00 + *(long *)(*(long *)(in_RDI + 8) + 0x3e0))) / 0xb40) {
              uVar4 = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x3e0);
              *(long **)(*(long *)(in_RDI + 8) + 0x3e0) = repeat_00;
              ffdblk(in_stack_000009f8,in_stack_000009f0,in_stack_000009e8);
              *(undefined8 *)(*(long *)(in_RDI + 8) + 0x3e0) = uVar4;
            }
            ffmaky((fitsfile *)CONCAT17(uVar3,in_stack_fffffffffffffe90),in_stack_fffffffffffffe8c,
                   (int *)0x16900c);
            ffgkyjj(in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                    (LONGLONG *)in_stack_fffffffffffffed8,
                    (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffec8);
            if (*(LONGLONG **)(*(long *)(in_RDI + 8) + 0x3e0) != in_stack_fffffffffffffec0) {
              ffmkyj(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,(LONGLONG)__ptr,
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            }
            ffrdef(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
            local_4 = *in_RSI;
          }
        }
        else {
          snprintf(&stack0xfffffffffffffec8,0x51,"Failed to create copy of the heap");
          ffpmsg((char *)0x1689af);
          ffclos(in_stack_fffffffffffffe98,
                 (int *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
          local_4 = *in_RSI;
        }
      }
      else {
        snprintf(&stack0xfffffffffffffec8,0x51,"Failed to create temporary file for the heap");
        ffpmsg((char *)0x168953);
        local_4 = *in_RSI;
      }
    }
    else {
      local_4 = *in_RSI;
    }
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int ffcmph(fitsfile *fptr,  /* I -FITS file pointer                         */
           int *status)     /* IO - error status                            */
/*
  compress the binary table heap by reordering the contents heap and
  recovering any unused space
*/
{
    fitsfile *tptr;
    int jj, typecode, pixsize, valid;
    long ii, buffsize = 10000, nblock, nbytes;
    LONGLONG  unused, overlap;
    LONGLONG repeat, offset;
    char *buffer, *tbuff, comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG];
    LONGLONG pcount;
    LONGLONG readheapstart, writeheapstart, endpos, t1heapsize, t2heapsize;

    if (*status > 0)
        return(*status);

    /* get information about the current heap */
    fftheap(fptr, NULL, &unused, &overlap, &valid, status);

    if (!valid)
       return(*status = BAD_HEAP_PTR);  /* bad heap pointers */

    /* return if this is not a binary table HDU or if the heap is OK as is */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 ||
         (unused == 0 && overlap == 0) || *status > 0 )
        return(*status);

    /* copy the current HDU to a temporary file in memory */
    if (ffinit( &tptr, "mem://tempheapfile", status) )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to create temporary file for the heap");
        ffpmsg(message);
        return(*status);
    }
    if ( ffcopy(fptr, tptr, 0, status) )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to create copy of the heap");
        ffpmsg(message);
        ffclos(tptr, status);
        return(*status);
    }

    buffer = (char *) malloc(buffsize);  /* allocate initial buffer */
    if (!buffer)
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to copy the heap");
        ffpmsg(message);
        ffclos(tptr, status);
        return(*status = MEMORY_ALLOCATION);
    }
    
    readheapstart  = (tptr->Fptr)->datastart + (tptr->Fptr)->heapstart;
    writeheapstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

    t1heapsize = (fptr->Fptr)->heapsize;  /* save original heap size */
    (fptr->Fptr)->heapsize = 0;  /* reset heap to zero */

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(tptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        /* copy heap data, row by row */
        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(tptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            /* increase size of buffer if necessary to read whole array */
            if (nbytes > buffsize)
            {
                tbuff = realloc(buffer, nbytes);

                if (tbuff)
                {
                    buffer = tbuff;
                    buffsize = nbytes;
                }
                else
                    *status = MEMORY_ALLOCATION;
            }

            /* If this is not the last HDU in the file, then check if */
            /* extending the heap would overwrite the following header. */
            /* If so, then have to insert more blocks. */
            if ( !((fptr->Fptr)->lasthdu) )
            {
              endpos = writeheapstart + (fptr->Fptr)->heapsize + nbytes;

              if (endpos > (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1])
              {
                /* calc the number of blocks that need to be added */
                nblock = (long) (((endpos - 1 - 
                         (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] ) 
                         / 2880) + 1);

                if (ffiblk(fptr, nblock, 1, status) > 0) /* insert blocks */
                {
                  snprintf(message,FLEN_ERRMSG,
       "Failed to extend the size of the variable length heap by %ld blocks.",
                   nblock);
                   ffpmsg(message);
                }
              }
            }

            /* read arrray of bytes from temporary copy */
            ffmbyt(tptr, readheapstart + offset, REPORT_EOF, status);
            ffgbyt(tptr, nbytes, buffer, status);

            /* write arrray of bytes back to original file */
            ffmbyt(fptr, writeheapstart + (fptr->Fptr)->heapsize, 
                    IGNORE_EOF, status);
            ffpbyt(fptr, nbytes, buffer, status);

            /* write descriptor */
            ffpdes(fptr, jj, ii, repeat, 
                   (fptr->Fptr)->heapsize, status);

            (fptr->Fptr)->heapsize += nbytes; /* update heapsize */

            if (*status > 0)
            {
               free(buffer);
               ffclos(tptr, status);
               return(*status);
            }
        }
    }

    free(buffer);
    ffclos(tptr, status);

    /* delete any empty blocks at the end of the HDU */
    nblock = (long) (( (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] -
             (writeheapstart + (fptr->Fptr)->heapsize) ) / 2880);

    if (nblock > 0)
    {
       t2heapsize = (fptr->Fptr)->heapsize;  /* save new heap size */
       (fptr->Fptr)->heapsize = t1heapsize;  /* restore  original heap size */

       ffdblk(fptr, nblock, status);
       (fptr->Fptr)->heapsize = t2heapsize;  /* reset correct heap size */
    }

    /* update the PCOUNT value (size of heap) */
    ffmaky(fptr, 2, status);         /* reset to beginning of header */

    ffgkyjj(fptr, "PCOUNT", &pcount, comm, status);
    if ((fptr->Fptr)->heapsize != pcount)
    {
        ffmkyj(fptr, "PCOUNT", (fptr->Fptr)->heapsize, comm, status);
    }
    ffrdef(fptr, status);  /* rescan new HDU structure */
    return(*status);
}